

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O0

void * Inta_ManInterpolate(Inta_Man_t *p,Sto_Man_t *pCnf,abctime TimeToStop,void *vVarsAB,
                          int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Aig_Man_t *p_00;
  int iVar9;
  int iVar10;
  abctime aVar11;
  abctime aVar12;
  Aig_Man_t *p_01;
  FILE *pFVar13;
  Aig_Obj_t **ppAVar14;
  bool bVar15;
  abctime clkTotal;
  Sto_Cls_t *pSStack_50;
  int RetValue;
  Sto_Cls_t *pClause;
  Aig_Obj_t *pObj;
  Aig_Man_t *pRes;
  int fVerbose_local;
  void *vVarsAB_local;
  abctime TimeToStop_local;
  Sto_Man_t *pCnf_local;
  Inta_Man_t *p_local;
  
  aVar11 = Abc_Clock();
  if ((TimeToStop == 0) || (aVar12 = Abc_Clock(), aVar12 <= TimeToStop)) {
    if ((pCnf->nVars < 1) || (pCnf->nClauses < 1)) {
      __assert_fail("pCnf->nVars > 0 && pCnf->nClauses > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                    ,0x3bc,
                    "void *Inta_ManInterpolate(Inta_Man_t *, Sto_Man_t *, abctime, void *, int)");
    }
    p->pCnf = pCnf;
    p->fVerbose = fVerbose;
    p->vVarsAB = (Vec_Int_t *)vVarsAB;
    p_01 = Aig_ManStart(10000);
    p->pAig = p_01;
    p_00 = p->pAig;
    iVar9 = Vec_IntSize(p->vVarsAB);
    Aig_IthVar(p_00,iVar9 + -1);
    Inta_ManResize(p);
    Inta_ManPrepareInter(p);
    if (p->fProofWrite != 0) {
      pFVar13 = fopen("proof.cnf_","w");
      p->pFile = (FILE *)pFVar13;
      p->Counter = 0;
    }
    pSStack_50 = p->pCnf->pHead;
    while( true ) {
      bVar15 = false;
      if (pSStack_50 != (Sto_Cls_t *)0x0) {
        bVar15 = (*(uint *)&pSStack_50->field_0x1c >> 1 & 1) != 0;
      }
      if (!bVar15) {
        iVar9 = Inta_ManProcessRoots(p);
        if (iVar9 == 0) goto LAB_00ba53af;
        pSStack_50 = p->pCnf->pHead;
        goto LAB_00ba5335;
      }
      Inta_ManProofWriteOne(p,pSStack_50);
      if ((TimeToStop != 0) && (aVar12 = Abc_Clock(), TimeToStop < aVar12)) break;
      pSStack_50 = pSStack_50->pNext;
    }
    Aig_ManStop(p_01);
    p->pAig = (Aig_Man_t *)0x0;
  }
  return (void *)0x0;
LAB_00ba5335:
  if (pSStack_50 == (Sto_Cls_t *)0x0) {
LAB_00ba53af:
    if (p->fProofWrite != 0) {
      fclose((FILE *)p->pFile);
      p->pFile = (FILE *)0x0;
    }
    if (fVerbose != 0) {
      uVar1 = p->pCnf->nVars;
      uVar2 = p->pCnf->nRoots;
      iVar9 = p->pCnf->nClauses;
      iVar3 = p->pCnf->nRoots;
      uVar4 = p->Counter;
      iVar5 = p->Counter;
      iVar6 = p->pCnf->nRoots;
      iVar7 = p->pCnf->nClauses;
      iVar8 = p->pCnf->nRoots;
      iVar10 = Sto_ManMemoryReport(p->pCnf);
      printf("Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB  ",
             ((double)(iVar5 - iVar6) * 1.0) / (double)(iVar7 - iVar8),
             ((double)iVar10 * 1.0) / 1048576.0,(ulong)uVar1,(ulong)uVar2,
             (ulong)(uint)(iVar9 - iVar3),(ulong)uVar4);
      aVar12 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar12 - aVar11);
      aVar12 = Abc_Clock();
      p->timeTotal = (aVar12 - aVar11) + p->timeTotal;
    }
    ppAVar14 = Inta_ManAigRead(p,p->pCnf->pTail);
    Aig_ObjCreateCo(p_01,*ppAVar14);
    Aig_ManCleanup(p_01);
    p->pAig = (Aig_Man_t *)0x0;
    return p_01;
  }
  if ((*(uint *)&pSStack_50->field_0x1c >> 1 & 1) == 0) {
    iVar9 = Inta_ManProofRecordOne(p,pSStack_50);
    if (iVar9 == 0) goto LAB_00ba53af;
    if ((TimeToStop != 0) && (aVar12 = Abc_Clock(), TimeToStop < aVar12)) {
      Aig_ManStop(p_01);
      p->pAig = (Aig_Man_t *)0x0;
      return (void *)0x0;
    }
  }
  pSStack_50 = pSStack_50->pNext;
  goto LAB_00ba5335;
}

Assistant:

void * Inta_ManInterpolate( Inta_Man_t * p, Sto_Man_t * pCnf, abctime TimeToStop, void * vVarsAB, int fVerbose )
{
    Aig_Man_t * pRes;
    Aig_Obj_t * pObj;
    Sto_Cls_t * pClause;
    int RetValue = 1;
    abctime clkTotal = Abc_Clock();

    if ( TimeToStop && Abc_Clock() > TimeToStop )
        return NULL;

    // check that the CNF makes sense
    assert( pCnf->nVars > 0 && pCnf->nClauses > 0 );
    p->pCnf = pCnf;
    p->fVerbose = fVerbose;
    p->vVarsAB = (Vec_Int_t *)vVarsAB;
    p->pAig = pRes = Aig_ManStart( 10000 );
    Aig_IthVar( p->pAig, Vec_IntSize(p->vVarsAB) - 1 );

    // adjust the manager
    Inta_ManResize( p );

    // prepare the interpolant computation
    Inta_ManPrepareInter( p );

    // construct proof for each clause
    // start the proof
    if ( p->fProofWrite )
    {
        p->pFile = fopen( "proof.cnf_", "w" );
        p->Counter = 0;
    }

    // write the root clauses
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        Inta_ManProofWriteOne( p, pClause );
        if ( TimeToStop && Abc_Clock() > TimeToStop )
        {
            Aig_ManStop( pRes );
            p->pAig = NULL;
            return NULL;
        }
    }

    // propagate root level assignments
    if ( Inta_ManProcessRoots( p ) )
    {
        // if there is no conflict, consider learned clauses
        Sto_ManForEachClause( p->pCnf, pClause )
        {
            if ( pClause->fRoot )
                continue;
            if ( !Inta_ManProofRecordOne( p, pClause ) )
            {
                RetValue = 0;
                break;
            }
            if ( TimeToStop && Abc_Clock() > TimeToStop )
            {
                Aig_ManStop( pRes );
                p->pAig = NULL;
                return NULL;
            }
        }
    }

    // stop the proof
    if ( p->fProofWrite )
    { 
        fclose( p->pFile );
//        Sat_ProofChecker( "proof.cnf_" );
        p->pFile = NULL;    
    }

    if ( fVerbose )
    {
//        ABC_PRT( "Interpo", Abc_Clock() - clkTotal );
    printf( "Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB  ", 
        p->pCnf->nVars, p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, p->Counter,  
        1.0*(p->Counter-p->pCnf->nRoots)/(p->pCnf->nClauses-p->pCnf->nRoots), 
        1.0*Sto_ManMemoryReport(p->pCnf)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
p->timeTotal += Abc_Clock() - clkTotal;
    }

    pObj = *Inta_ManAigRead( p, p->pCnf->pTail );
    Aig_ObjCreateCo( pRes, pObj );
    Aig_ManCleanup( pRes );

    p->pAig = NULL;
    return pRes;
    
}